

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deque.hpp
# Opt level: O3

void __thiscall
ft::deque<int,_ft::allocator<int>_>::deque
          (deque<int,_ft::allocator<int>_> *this,deque<int,_ft::allocator<int>_> *other)

{
  constDequeIterator<int,_64UL> local_68;
  undefined **local_40;
  pointer local_38;
  pointer local_30;
  pointer local_28;
  map_pointer local_20;
  
  (this->m_start)._vptr_dequeIterator = (_func_int **)&PTR__dequeIterator_0010ecc8;
  (this->m_finish)._vptr_dequeIterator = (_func_int **)&PTR__dequeIterator_0010ecc8;
  this->m_map = (map_pointer)0x0;
  this->m_map_size = 0;
  this->m_chunks = 0;
  this->m_size = 0;
  dequeInit(this,other->m_size);
  if ((deque<int,_ft::allocator<int>_> *)&stack0xffffffffffffffc0 != other) {
    local_38 = (other->m_start).m_cur;
    local_30 = (other->m_start).m_first;
    local_28 = (other->m_start).m_last;
    local_20 = (other->m_start).m_node;
  }
  local_40 = &PTR__dequeIterator_0010ed10;
  if (&other->m_finish != &local_68.super_dequeIterator<int,_64UL>) {
    local_68.super_dequeIterator<int,_64UL>.m_cur = (other->m_finish).m_cur;
    local_68.super_dequeIterator<int,_64UL>.m_first = (other->m_finish).m_first;
    local_68.super_dequeIterator<int,_64UL>.m_last = (other->m_finish).m_last;
    local_68.super_dequeIterator<int,_64UL>.m_node = (other->m_finish).m_node;
  }
  local_68.super_dequeIterator<int,_64UL>._vptr_dequeIterator =
       (_func_int **)&PTR__dequeIterator_0010ed10;
  deque<int,ft::allocator<int>>::assign<ft::constDequeIterator<int,64ul>>
            ((deque<int,ft::allocator<int>> *)this,
             (constDequeIterator<int,_64UL> *)&stack0xffffffffffffffc0,&local_68,(type *)0x0);
  return;
}

Assistant:

deque(deque const & other):
		m_map(NULL),
		m_map_size(0),
		m_chunks(0),
		m_size(0),
		m_alloc(other.get_allocator()) {
		this->dequeInit(other.size());
		this->assign(other.begin(), other.end());
	}